

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void load_vector_int<QPDF::HSharedObjectEntry,int>
               (BitStream *bit_stream,int nitems,
               vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *vec,
               int bits_wanted,offset_in_HSharedObjectEntry_to_int field)

{
  ulong uVar1;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *this;
  BitStream *this_00;
  int iVar2;
  size_t sVar3;
  reference pvVar4;
  logic_error *this_01;
  size_type local_58;
  HSharedObjectEntry local_4c;
  ulong local_40;
  size_t i;
  offset_in_HSharedObjectEntry_to_int oStack_30;
  bool append;
  offset_in_HSharedObjectEntry_to_int field_local;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *pvStack_20;
  int bits_wanted_local;
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *vec_local;
  BitStream *pBStack_10;
  int nitems_local;
  BitStream *bit_stream_local;
  
  oStack_30 = field;
  field_local._4_4_ = bits_wanted;
  pvStack_20 = vec;
  vec_local._4_4_ = nitems;
  pBStack_10 = bit_stream;
  i._7_1_ = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::empty
                      (vec);
  local_40 = 0;
  while( true ) {
    uVar1 = local_40;
    sVar3 = QIntC::to_size<int>((int *)((long)&vec_local + 4));
    this = pvStack_20;
    if (sVar3 <= uVar1) break;
    if ((i._7_1_ & 1) != 0) {
      memset(&local_4c,0,0xc);
      QPDF::HSharedObjectEntry::HSharedObjectEntry(&local_4c);
      std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::push_back
                (this,&local_4c);
    }
    this_00 = pBStack_10;
    sVar3 = QIntC::to_size<int>((int *)((long)&field_local + 4));
    iVar2 = BitStream::getBitsInt(this_00,sVar3);
    pvVar4 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::at
                       (pvStack_20,local_40);
    *(int *)((long)&pvVar4->delta_group_length + oStack_30) = iVar2;
    local_40 = local_40 + 1;
  }
  local_58 = std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::size
                       (pvStack_20);
  iVar2 = QIntC::to_int<unsigned_long>(&local_58);
  if (iVar2 != vec_local._4_4_) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"vector has wrong size in load_vector_int");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  BitStream::skipToNextByte(pBStack_10);
  return;
}

Assistant:

static void
load_vector_int(
    BitStream& bit_stream, int nitems, std::vector<T>& vec, int bits_wanted, int_type T::* field)
{
    bool append = vec.empty();
    // nitems times, read bits_wanted from the given bit stream, storing results in the ith vector
    // entry.

    for (size_t i = 0; i < QIntC::to_size(nitems); ++i) {
        if (append) {
            vec.push_back(T());
        }
        vec.at(i).*field = bit_stream.getBitsInt(QIntC::to_size(bits_wanted));
    }
    if (QIntC::to_int(vec.size()) != nitems) {
        throw std::logic_error("vector has wrong size in load_vector_int");
    }
    // The PDF spec says that each hint table starts at a byte boundary.  Each "row" actually must
    // start on a byte boundary.
    bit_stream.skipToNextByte();
}